

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O2

optional<metaf::Temperature> metaf::Temperature::fromRemarkString(string *s)

{
  optional<unsigned_int> oVar1;
  ulong uVar2;
  _Storage<unsigned_int,_true> _Var3;
  long lVar4;
  ulong uVar5;
  double dVar6;
  optional<metaf::Temperature> oVar7;
  
  if ((s->_M_string_length == 4) && ((*(s->_M_dataplus)._M_p & 0xfeU) == 0x30)) {
    oVar1 = strToUint(s,1,3);
    if (((ulong)oVar1.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_int> >> 0x20 & 1) != 0) {
      _Var3._M_value =
           -oVar1.super__Optional_base<unsigned_int,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_int>._M_payload;
      if (*(s->_M_dataplus)._M_p != '1') {
        _Var3._M_value =
             oVar1.super__Optional_base<unsigned_int,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_int>._M_payload;
      }
      uVar5 = 0x100000000;
      dVar6 = round((double)((float)(int)_Var3._M_value / 10.0) * 10.0);
      uVar2 = (ulong)(uint)(int)dVar6;
      lVar4 = (ulong)((float)(int)_Var3._M_value / 10.0 < 0.0) + 0x100000100;
      goto LAB_0018c293;
    }
  }
  lVar4 = 0;
  uVar2 = 0;
  uVar5 = 0;
LAB_0018c293:
  oVar7.super__Optional_base<metaf::Temperature,_true,_true>._M_payload.
  super__Optional_payload_base<metaf::Temperature>._M_payload._0_8_ = uVar2 | uVar5;
  oVar7.super__Optional_base<metaf::Temperature,_true,_true>._M_payload.
  super__Optional_payload_base<metaf::Temperature>._8_8_ = lVar4;
  return (optional<metaf::Temperature>)
         oVar7.super__Optional_base<metaf::Temperature,_true,_true>._M_payload.
         super__Optional_payload_base<metaf::Temperature>;
}

Assistant:

std::optional<Temperature> Temperature::fromRemarkString(const std::string & s) {
	//static const std::regex ("([01])(\\d\\d\\d)");
	std::optional<Temperature> error;
	if (s.length() != 4) return error;
	if (s[0] != '0' && s[0] != '1') return error;
	const auto t = strToUint(s, 1, 3);
	if (!t.has_value()) return error;
	int tValueSigned = int(*t);
	if (s[0] == '1') tValueSigned = -tValueSigned;
	return Temperature(tValueSigned / 10.0f);
}